

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

void __thiscall ON_PolyEdgeSegment::Init(ON_PolyEdgeSegment *this)

{
  double dVar1;
  
  ON_COMPONENT_INDEX::UnSet(&this->m_component_index);
  (this->m_object_id).Data1 = 0;
  (this->m_object_id).Data2 = 0;
  (this->m_object_id).Data3 = 0;
  (this->m_object_id).Data4[0] = '\0';
  (this->m_object_id).Data4[1] = '\0';
  (this->m_object_id).Data4[2] = '\0';
  (this->m_object_id).Data4[3] = '\0';
  (this->m_object_id).Data4[4] = '\0';
  (this->m_object_id).Data4[5] = '\0';
  (this->m_object_id).Data4[6] = '\0';
  (this->m_object_id).Data4[7] = '\0';
  this->m_brep = (ON_Brep *)0x0;
  this->m_trim = (ON_BrepTrim *)0x0;
  this->m_edge = (ON_BrepEdge *)0x0;
  this->m_face = (ON_BrepFace *)0x0;
  this->m_surface = (ON_Surface *)0x0;
  dVar1 = ON_Interval::EmptyInterval.m_t[1];
  (this->m_edge_domain).m_t[0] = ON_Interval::EmptyInterval.m_t[0];
  (this->m_edge_domain).m_t[1] = dVar1;
  dVar1 = ON_Interval::EmptyInterval.m_t[1];
  (this->m_trim_domain).m_t[0] = ON_Interval::EmptyInterval.m_t[0];
  (this->m_trim_domain).m_t[1] = dVar1;
  ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,(ON_Curve *)0x0);
  ClearEvalCacheHelper(this);
  return;
}

Assistant:

void ON_PolyEdgeSegment::Init()
{
  m_component_index.UnSet();
  m_object_id = ON_nil_uuid;
  m_brep = 0;
  m_trim = 0;
  m_edge = 0;
  m_face = 0;
  m_surface = 0;
  m_edge_domain = ON_Interval::EmptyInterval;
  m_trim_domain = ON_Interval::EmptyInterval;
  ON_CurveProxy::SetProxyCurve(0);

  ClearEvalCacheHelper();
}